

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# material.h
# Opt level: O2

bool __thiscall
BRDFMaterial::sample
          (BRDFMaterial *this,Vector3f *col,Hit *hit,Ray *ray,Vector3f *coe,Runtime *rt,bool emit)

{
  mt19937 *g;
  undefined1 auVar1 [16];
  float fVar2;
  float f;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined1 auVar6 [64];
  Vector3f hitp;
  Vector3f p2;
  Vector3f p1;
  Vector3f p0;
  Vector3f np;
  undefined1 local_cc [12];
  Ray local_c0;
  undefined1 local_a4 [24];
  Vector3f local_8c;
  Vector3f local_80;
  Vector3f local_74;
  Vector3f local_68;
  Vector2f local_5c;
  Vector3f local_54;
  Vector3f local_48 [2];
  undefined1 extraout_var [60];
  
  g = rt->g;
  if (emit) {
    Vector2f::Vector2f(&local_5c,&hit->pos);
    Texture::get((Texture *)local_cc,(Vector2f *)&this->emissionColor);
    ::operator*((Vector3f *)local_cc,coe);
    Vector3f::operator+=(col,(Vector3f *)(local_cc + 0xc));
  }
  operator-(&ray->d);
  fVar2 = Vector3f::dot(&hit->norm,(Vector3f *)(local_cc + 0xc));
  if (0.0 <= fVar2) {
    Ray::pos((Ray *)local_cc,hit->t);
    Vector3f::Vector3f(&local_68,&hit->norm);
    Vector3f::Vector3f(&local_74,0.0);
    Vector3f::Vector3f(&local_80,0.0);
    createCoordinateSystem(&local_68,&local_74,&local_80);
    auVar6._0_4_ = randf(g);
    auVar6._4_60_ = extraout_var;
    if (auVar6._0_4_ < 0.0) {
      f = sqrtf(auVar6._0_4_);
    }
    else {
      auVar1 = vsqrtss_avx(auVar6._0_16_,auVar6._0_16_);
      f = auVar1._0_4_;
    }
    fVar3 = randf(g);
    fVar3 = fVar3 * 3.1415927 + fVar3 * 3.1415927;
    auVar1 = vfnmadd231ss_fma(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)f),ZEXT416((uint)f));
    if (auVar1._0_4_ < 0.0) {
      fVar4 = sqrtf(auVar1._0_4_);
    }
    else {
      auVar1 = vsqrtss_avx(auVar1,auVar1);
      fVar4 = auVar1._0_4_;
    }
    fVar5 = cosf(fVar3);
    fVar3 = sinf(fVar3);
    ::operator*(f,&local_8c);
    ::operator*(fVar5 * fVar4,(Vector3f *)(local_a4 + 0xc));
    operator+(&local_8c,(Vector3f *)(local_a4 + 0xc));
    ::operator*(fVar3 * fVar4,(Vector3f *)local_a4);
    operator+((Vector3f *)(local_cc + 0xc),(Vector3f *)local_a4);
    BRDF((BRDFMaterial *)local_a4,(Vector3f *)this,&ray->d,(Hit *)(local_48 + 1));
    ::operator*(coe,(Vector3f *)local_a4);
    operator/(&local_8c,f);
    operator/((Vector3f *)(local_cc + 0xc),2.0);
    Vector3f::operator=(coe,(Vector3f *)(local_cc + 0xc));
    Vector3f::Vector3f(local_48,(Vector3f *)local_cc);
    Vector3f::Vector3f(&local_54,local_48 + 1);
    Ray::Ray((Ray *)(local_cc + 0xc),local_48,&local_54,3.4028235e+38,0.0);
    Ray::operator=(ray,(Ray *)(local_cc + 0xc));
  }
  return 0.0 <= fVar2;
}

Assistant:

bool sample(Vector3f& col, const Hit& hit, Ray& ray, Vector3f& coe, Runtime& rt, bool emit) const override{
		RNG_TYPE& g = *rt.g;
//		float& davg = rt.davg[this->id];
//		float& favg = rt.favg[this->id];
//		if (!this->emissionColor.empty) {
//			std::cerr << emit << "?\n";
//		}
		if(emit) col += this->emissionColor.get(hit.pos) * coe;
		if (Vector3f::dot(hit.norm, -ray.d) < 0) return 0;
		Vector3f hitp = ray.pos(hit.t);
		Vector3f p0 = hit.norm, p1, p2;
		createCoordinateSystem(p0, p1, p2);
		float r = this->roughness;
#if SAMPLER == 0
		if (0)//g() % 2)
		{
			float cog = sqrtf(randf(g)), phi = randf(g) * PI * 2;
			float sinTheta = sqrtf(1 - cog * cog);
			float C = cog * 2;
			float y = sinTheta * cosf(phi), z = sinTheta * sinf(phi);
			Vector3f np = cog * p0 + y * p1 + z * p2;
			Vector3f H = np - ray.d; H.normalize();
			float co = Vector3f::dot(H, p0);
			float D = expf((1 - 1.0 / (co * co)) / (r * r)) / (r * r * co * co * co);
			if (D < 0) D = 0;
			coe = coe * this->BRDF0(ray.d, np, hit) / cog;
//			coe = coe * this->BRDF0(ray.d, np, hit) / cog / 2 * 2;// *((C * C) / (C * C + D * D)) * 2;
			ray = Ray(hitp, np);
		}
		else
		{
			int fail = 0;
			while (1)
			{
				float u = randf(g);
				float co = sqrtf(1 / (1 - r * r * logf(1 - u)));
				float d = expf((1 - 1.0 / (co * co)) / (r * r)) / (r * r * co * co * co);
				//			float D = d;// / co;
				float phi = randf(g) * 2 * PI, g = sqrtf(1 - co * co);
				Vector3f H = p0 * co + (p1 * cosf(phi) + p2 * sinf(phi)) * g;
				Vector3f np = H * 2 * Vector3f::dot(H, -ray.d) + ray.d; np.normalize();
				if (Vector3f::dot(np, p0) < 0)
				{
					fail++;
					if (fail >= 20)
					{
						return 0;
					}
					continue;
				}
				//			float C = Vector3f::dot(p0, np) * 2;
				d /= Vector3f::dot(np, H) * 2;
				davg = davg * 0.95 + 0.05 * d;
				favg = favg * 0.95 + 0.05 * (1 + fail);
				coe = coe * this->BRDF(ray.d, np, hit) / d * (davg/favg) / 2;
				//				coe = coe * this->BRDF1(ray.d, np, hit) / d * davg * 2;
//				coe = coe * this->BRDF1(ray.d, np, hit) * davg / d;// *2;// *((D * D) / (C * C + D * D)) * 2;
				ray = Ray(hitp, np);
				break;
			}
		}
#elif SAMPLER == 1
		float C = sqrtf(randf(g)), phi = randf(g) * PI * 2;
		float sinTheta = sqrtf(1 - C * C);
		float y = sinTheta * cosf(phi), z = sinTheta * sinf(phi);
		Vector3f np = C * p0 + y * p1 + z * p2;
		coe = coe * this->BRDF(ray.d, np, hit) / C / 2;
		ray = Ray(hitp, np);
#else
		float C = randf(g), phi = randf(g) * PI * 2;
		float sinTheta = sqrtf(1 - C * C);
		float y = sinTheta * cosf(phi), z = sinTheta * sinf(phi);
		Vector3f np = C * p0 + y * p1 + z * p2;
		coe = coe * this->BRDF(ray.d, np, hit);
		ray = Ray(hitp, np);
#endif
#undef SAMPLER
		return 1;
	}